

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_accounting.c
# Opt level: O3

int mm_acct_save_TAUTH(void *db,mm_telco_t *telco,char *terminal_id,
                      dlog_mt_funf_card_auth_t *auth_request)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  char phone_number_string [21];
  char received_time_str [16];
  char card_number_string [25];
  char call_type_str [38];
  char sql [512];
  
  memset(sql,0,0x200);
  phone_number_string[0x10] = '\0';
  phone_number_string[0x11] = '\0';
  phone_number_string[0x12] = '\0';
  phone_number_string[0x13] = '\0';
  phone_number_string[0x14] = '\0';
  phone_number_string[0] = '\0';
  phone_number_string[1] = '\0';
  phone_number_string[2] = '\0';
  phone_number_string[3] = '\0';
  phone_number_string[4] = '\0';
  phone_number_string[5] = '\0';
  phone_number_string[6] = '\0';
  phone_number_string[7] = '\0';
  phone_number_string[8] = '\0';
  phone_number_string[9] = '\0';
  phone_number_string[10] = '\0';
  phone_number_string[0xb] = '\0';
  phone_number_string[0xc] = '\0';
  phone_number_string[0xd] = '\0';
  phone_number_string[0xe] = '\0';
  phone_number_string[0xf] = '\0';
  card_number_string[0x10] = '\0';
  card_number_string[0x11] = '\0';
  card_number_string[0x12] = '\0';
  card_number_string[0x13] = '\0';
  card_number_string[0x14] = '\0';
  card_number_string[0x15] = '\0';
  card_number_string[0x16] = '\0';
  card_number_string[0x17] = '\0';
  card_number_string[0x18] = '\0';
  card_number_string[0] = '\0';
  card_number_string[1] = '\0';
  card_number_string[2] = '\0';
  card_number_string[3] = '\0';
  card_number_string[4] = '\0';
  card_number_string[5] = '\0';
  card_number_string[6] = '\0';
  card_number_string[7] = '\0';
  card_number_string[8] = '\0';
  card_number_string[9] = '\0';
  card_number_string[10] = '\0';
  card_number_string[0xb] = '\0';
  card_number_string[0xc] = '\0';
  card_number_string[0xd] = '\0';
  card_number_string[0xe] = '\0';
  card_number_string[0xf] = '\0';
  call_type_str[0x20] = '\0';
  call_type_str[0x21] = '\0';
  call_type_str[0x22] = '\0';
  call_type_str[0x23] = '\0';
  call_type_str[0x24] = '\0';
  call_type_str[0x25] = '\0';
  call_type_str[0x10] = '\0';
  call_type_str[0x11] = '\0';
  call_type_str[0x12] = '\0';
  call_type_str[0x13] = '\0';
  call_type_str[0x14] = '\0';
  call_type_str[0x15] = '\0';
  call_type_str[0x16] = '\0';
  call_type_str[0x17] = '\0';
  call_type_str[0x18] = '\0';
  call_type_str[0x19] = '\0';
  call_type_str[0x1a] = '\0';
  call_type_str[0x1b] = '\0';
  call_type_str[0x1c] = '\0';
  call_type_str[0x1d] = '\0';
  call_type_str[0x1e] = '\0';
  call_type_str[0x1f] = '\0';
  call_type_str[0] = '\0';
  call_type_str[1] = '\0';
  call_type_str[2] = '\0';
  call_type_str[3] = '\0';
  call_type_str[4] = '\0';
  call_type_str[5] = '\0';
  call_type_str[6] = '\0';
  call_type_str[7] = '\0';
  call_type_str[8] = '\0';
  call_type_str[9] = '\0';
  call_type_str[10] = '\0';
  call_type_str[0xb] = '\0';
  call_type_str[0xc] = '\0';
  call_type_str[0xd] = '\0';
  call_type_str[0xe] = '\0';
  call_type_str[0xf] = '\0';
  received_time_str[0] = '\0';
  received_time_str[1] = '\0';
  received_time_str[2] = '\0';
  received_time_str[3] = '\0';
  received_time_str[4] = '\0';
  received_time_str[5] = '\0';
  received_time_str[6] = '\0';
  received_time_str[7] = '\0';
  received_time_str[8] = '\0';
  received_time_str[9] = '\0';
  received_time_str[10] = '\0';
  received_time_str[0xb] = '\0';
  received_time_str[0xc] = '\0';
  received_time_str[0xd] = '\0';
  received_time_str[0xe] = '\0';
  received_time_str[0xf] = '\0';
  phone_num_to_string(phone_number_string,0x15,auth_request->phone_number,10);
  phone_num_to_string(card_number_string,0x19,auth_request->card_number,0xc);
  call_type_to_string(auth_request->call_type & 0x7f,call_type_str,0x26);
  bVar1 = auth_request->exp_mm;
  if (0x11 < bVar1) {
    auth_request->exp_mm = '\0';
    bVar1 = 0;
  }
  uVar4 = (ulong)(auth_request->exp_yy + 0x2000);
  if (0x99 < auth_request->exp_yy) {
    uVar4 = 0;
  }
  printf("\t\tCard Auth request: Terminal: %s, Phone number: %s, seq=%d, card#: %s, exp: %02x/%04x, service_code: %d, PIN: %02x, ctrlflag: 0x%02x carrier: %d, Call_type: 0x%02x (%s,) card_ref_num:0x%02x, unk:0x%04x, unk2:0x%04x\n"
         ,terminal_id,phone_number_string,(ulong)auth_request->seq,card_number_string,(ulong)bVar1,
         uVar4,(ulong)auth_request->service_code,
         (ulong)(ushort)(auth_request->pin << 8 | auth_request->pin >> 8),
         (ulong)auth_request->control_flag,(ulong)auth_request->carrier_ref,
         (ulong)auth_request->call_type,call_type_str,(ulong)auth_request->card_ref_num,
         (ulong)auth_request->unknown,(ulong)auth_request->unknown2);
  pcVar3 = received_time_to_db_string(received_time_str,0x10);
  snprintf(sql,0x200,
           "INSERT INTO TAUTH ( TERMINAL_ID, RECEIVED_DATE, RECEIVED_TIME,INTERNATIONAL_CALL_IND,CALLED_TELEPHONE_NO,CARRIER_XREF_NUMBER,CARD_NUMBER,SERVICE_CODE,CARD_EXPIRY_DATE,INITIAL_DATE,DISCRETIONARY,SPARE_FORMATTED,CARD_DATA,PIN,CALL_TYPE,CARD_REF_NO,SEQUENCE_NO,FOLLOW_ON_IND,TELCO_ID, REGION_CODE) VALUES (  \"%s\",%s,%d,\"%s\",%d,\"%s\",%d,%04x%02x,%04x%02x,%d,%d,%d,%d,%d,%d,%d,%d,\"%c%c\",\"%c%c%c\");"
           ,terminal_id,pcVar3,0,phone_number_string,(ulong)auth_request->carrier_ref,
           card_number_string,(ulong)auth_request->service_code,uVar4,(ulong)auth_request->exp_mm,0,
           0,(ulong)auth_request->control_flag,0,0,
           (ulong)(ushort)(auth_request->pin << 8 | auth_request->pin >> 8),
           (ulong)auth_request->call_type,(ulong)auth_request->card_ref_num,(ulong)auth_request->seq
           ,(ulong)(auth_request->control_flag >> 2 & 1),(ulong)telco->id[0],(ulong)telco->id[1],
           (ulong)telco->region_code[0],(ulong)telco->region_code[1],(ulong)telco->region_code[2]);
  iVar2 = mm_sql_exec(db,sql);
  return iVar2;
}

Assistant:

int mm_acct_save_TAUTH(void *db, mm_telco_t *telco, char* terminal_id, dlog_mt_funf_card_auth_t* auth_request) {
    char sql[512] = { 0 };
    char phone_number_string[21] = { 0 };
    char card_number_string[25] = { 0 };
    char call_type_str[38] = { 0 };
    char received_time_str[16] = { 0 };
    int exp_year;

    phone_num_to_string(phone_number_string, sizeof(phone_number_string), auth_request->phone_number,
        sizeof(auth_request->phone_number));
    phone_num_to_string(card_number_string, sizeof(card_number_string), auth_request->card_number,
        sizeof(auth_request->card_number));
    call_type_to_string(auth_request->call_type & (~FLAG_CDR_IXL), call_type_str, sizeof(call_type_str));

    /* Some calling cards do not contain an expiration date, and the terminal returns 0xee
     * for the exp_mm and exp_yy.  Zero them out in this case.
     */
    if (auth_request->exp_mm >= 0x12) {
        auth_request->exp_mm = 0;
    }

    if (auth_request->exp_yy > 0x99) {
        exp_year = 0;
    }
    else {
        exp_year = 0x2000 + auth_request->exp_yy; /* Fixme: in 2100 */
    }

    printf("\t\tCard Auth request: Terminal: %s, Phone number: %s, seq=%d, card#: %s, exp: %02x/%04x, service_code: %d, PIN: %02x, ctrlflag: 0x%02x carrier: %d, Call_type: 0x%02x (%s,) card_ref_num:0x%02x, unk:0x%04x, unk2:0x%04x\n",
        terminal_id,
        phone_number_string,
        auth_request->seq,
        card_number_string,
        auth_request->exp_mm,
        exp_year,
        auth_request->service_code,
        ((auth_request->pin & 0xFF) << 8) | ((auth_request->pin & 0xFF00) >> 8),
        auth_request->control_flag,
        auth_request->carrier_ref,
        auth_request->call_type,
        call_type_str,
        auth_request->card_ref_num,
        auth_request->unknown,
        auth_request->unknown2);


    snprintf(sql, sizeof(sql), "INSERT " SQL_IGNORE "INTO TAUTH ( TERMINAL_ID, RECEIVED_DATE, RECEIVED_TIME,"
        "INTERNATIONAL_CALL_IND,"
        "CALLED_TELEPHONE_NO,"
        "CARRIER_XREF_NUMBER,"
        "CARD_NUMBER,"
        "SERVICE_CODE,"
        "CARD_EXPIRY_DATE,"
        "INITIAL_DATE,"
        "DISCRETIONARY,"
        "SPARE_FORMATTED,"
        "CARD_DATA,"
        "PIN,"
        "CALL_TYPE,"
        "CARD_REF_NO,"
        "SEQUENCE_NO,"
        "FOLLOW_ON_IND,"
        "TELCO_ID, REGION_CODE"
        ") VALUES ( " \
        " \"%s\",%s,%d,\"%s\",%d,\"%s\",%d,%04x%02x,%04x%02x,%d,%d,%d,%d,%d,%d,%d,%d," TELCO_ID_REGION_CODE ");",
        terminal_id,
        received_time_to_db_string(received_time_str, sizeof(received_time_str)),
        0,
        phone_number_string,
        auth_request->carrier_ref,
        card_number_string,
        auth_request->service_code,
        exp_year,
        auth_request->exp_mm,
        0, //auth_request->init_yy + 0x2000,
        0, //auth_request->init_mm,
        auth_request->control_flag,
        0,
        0,
        ((auth_request->pin & 0xFF) << 8) | ((auth_request->pin & 0xFF00) >> 8),
        auth_request->call_type,
        auth_request->card_ref_num,
        auth_request->seq,
        (auth_request->control_flag & TAUTH_FOLLOW_ON_IND) ? 1 : 0,
        telco->id[0], telco->id[1],
        telco->region_code[0], telco->region_code[1], telco->region_code[2]);

    return mm_sql_exec(db, sql);
}